

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMFImporter_Material.cpp
# Opt level: O3

void __thiscall Assimp::AMFImporter::ParseNode_TexMap(AMFImporter *this,bool pUseOldName)

{
  size_t *psVar1;
  char *pcVar2;
  CAMFImporter_NodeElement *pCVar3;
  uint uVar4;
  int iVar5;
  undefined4 extraout_var;
  char *__s;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  CAMFImporter_NodeElement *pNode;
  undefined8 extraout_RAX;
  undefined8 extraout_RAX_00;
  undefined8 extraout_RAX_01;
  undefined8 extraout_RAX_02;
  undefined8 extraout_RAX_03;
  undefined8 extraout_RAX_04;
  undefined8 extraout_RAX_05;
  undefined8 extraout_RAX_06;
  undefined8 extraout_RAX_07;
  undefined8 extraout_RAX_08;
  _List_node_base *p_Var6;
  runtime_error *prVar7;
  undefined1 **ppuVar8;
  undefined7 in_register_00000031;
  AMFImporter *this_00;
  uint uVar9;
  char *__end;
  ulong uVar10;
  float fVar11;
  string an;
  string btexid;
  string gtexid;
  string rtexid;
  string atexid;
  string local_118;
  AMFImporter *local_f8;
  string local_f0;
  uint local_d0;
  uint local_cc;
  uint local_c8;
  uint local_c4;
  uint local_c0;
  uint local_bc;
  CAMFImporter_NodeElement *local_b8;
  undefined1 *local_b0;
  long local_a8;
  undefined1 local_a0 [16];
  undefined1 *local_90;
  long local_88;
  undefined1 local_80 [16];
  undefined1 *local_70;
  long local_68;
  undefined1 local_60 [16];
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40 [16];
  undefined4 extraout_var_00;
  
  local_d0 = (uint)CONCAT71(in_register_00000031,pUseOldName);
  local_70 = local_60;
  local_68 = 0;
  local_60[0] = 0;
  local_90 = local_80;
  local_88 = 0;
  local_80[0] = 0;
  local_b0 = local_a0;
  local_a8 = 0;
  local_a0[0] = 0;
  local_50 = local_40;
  local_48 = 0;
  local_40[0] = 0;
  local_f8 = this;
  uVar4 = (*this->mReader->_vptr_IIrrXMLReader[4])();
  if (0 < (int)uVar4) {
    uVar10 = 0;
    do {
      iVar5 = (*local_f8->mReader->_vptr_IIrrXMLReader[5])(local_f8->mReader,uVar10);
      std::__cxx11::string::string
                ((string *)&local_118,(char *)CONCAT44(extraout_var,iVar5),(allocator *)&local_f0);
      iVar5 = std::__cxx11::string::compare((char *)&local_118);
      if (iVar5 == 0) {
        iVar5 = (*local_f8->mReader->_vptr_IIrrXMLReader[6])();
        __s = (char *)CONCAT44(extraout_var_00,iVar5);
        ppuVar8 = &local_70;
LAB_003cadf1:
        pcVar2 = ppuVar8[1];
        strlen(__s);
        std::__cxx11::string::_M_replace((ulong)ppuVar8,0,pcVar2,(ulong)__s);
      }
      else {
        iVar5 = std::__cxx11::string::compare((char *)&local_118);
        if (iVar5 == 0) {
          iVar5 = (*local_f8->mReader->_vptr_IIrrXMLReader[6])();
          __s = (char *)CONCAT44(extraout_var_01,iVar5);
          ppuVar8 = &local_90;
          goto LAB_003cadf1;
        }
        iVar5 = std::__cxx11::string::compare((char *)&local_118);
        if (iVar5 == 0) {
          iVar5 = (*local_f8->mReader->_vptr_IIrrXMLReader[6])();
          __s = (char *)CONCAT44(extraout_var_02,iVar5);
          ppuVar8 = &local_b0;
          goto LAB_003cadf1;
        }
        iVar5 = std::__cxx11::string::compare((char *)&local_118);
        if (iVar5 == 0) {
          iVar5 = (*local_f8->mReader->_vptr_IIrrXMLReader[6])();
          __s = (char *)CONCAT44(extraout_var_03,iVar5);
          ppuVar8 = &local_50;
          goto LAB_003cadf1;
        }
        Throw_IncorrectAttr(local_f8,&local_118);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._M_dataplus._M_p != &local_118.field_2) {
        operator_delete(local_118._M_dataplus._M_p);
      }
      uVar9 = (int)uVar10 + 1;
      uVar10 = (ulong)uVar9;
    } while (uVar4 != uVar9);
  }
  pNode = (CAMFImporter_NodeElement *)operator_new(0xf8);
  this_00 = local_f8;
  pCVar3 = local_f8->mNodeElement_Cur;
  pNode->Type = ENET_TexMap;
  (pNode->ID)._M_dataplus._M_p = (pointer)&(pNode->ID).field_2;
  (pNode->ID)._M_string_length = 0;
  (pNode->ID).field_2._M_local_buf[0] = '\0';
  pNode->Parent = pCVar3;
  (pNode->Child).
  super__List_base<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_>._M_impl.
  _M_node.super__List_node_base._M_prev = (_List_node_base *)&pNode->Child;
  (pNode->Child).
  super__List_base<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_>._M_impl.
  _M_node.super__List_node_base._M_next = (_List_node_base *)&pNode->Child;
  (pNode->Child).
  super__List_base<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_>._M_impl.
  _M_node._M_size = 0;
  pNode->_vptr_CAMFImporter_NodeElement =
       (_func_int **)&PTR__CAMFImporter_NodeElement_TexMap_007fe9c8;
  pNode[1]._vptr_CAMFImporter_NodeElement = (_func_int **)0x0;
  *(undefined8 *)&pNode[1].Type = 0;
  pNode[1].ID._M_dataplus._M_p = (pointer)0x0;
  pNode[1].ID._M_string_length = 0;
  *(undefined4 *)&pNode[1].ID.field_2 = 0;
  *(list<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_> **)
   ((long)&pNode[1].ID.field_2 + 8) = &pNode[1].Child;
  pNode[1].Parent = (CAMFImporter_NodeElement *)0x0;
  *(undefined1 *)
   &pNode[1].Child.
    super__List_base<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_>.
    _M_impl._M_node.super__List_node_base._M_next = 0;
  pNode[1].Child.
  super__List_base<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_>._M_impl.
  _M_node._M_size = (size_t)&pNode[2].Type;
  pNode[2]._vptr_CAMFImporter_NodeElement = (_func_int **)0x0;
  *(undefined1 *)&pNode[2].Type = ENET_Color;
  pNode[2].ID._M_string_length = (size_type)((long)&pNode[2].ID.field_2 + 8);
  pNode[2].ID.field_2._M_allocated_capacity = 0;
  pNode[2].ID.field_2._M_local_buf[8] = '\0';
  pNode[2].Child.
  super__List_base<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_>._M_impl.
  _M_node.super__List_node_base._M_next =
       (_List_node_base *)
       &pNode[2].Child.
        super__List_base<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_>.
        _M_impl._M_node._M_size;
  pNode[2].Child.
  super__List_base<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_>._M_impl.
  _M_node.super__List_node_base._M_prev = (_List_node_base *)0x0;
  *(undefined1 *)
   &pNode[2].Child.
    super__List_base<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_>.
    _M_impl._M_node._M_size = 0;
  if (((local_68 == 0) && (local_88 == 0)) && (local_a8 == 0)) {
    prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_118,"ParseNode_TexMap. At least one texture ID must be defined.","")
    ;
    std::runtime_error::runtime_error(prVar7,(string *)&local_118);
    *(undefined ***)prVar7 = &PTR__runtime_error_007fc4b8;
    __cxa_throw(prVar7,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  XML_CheckNode_MustHaveChildren(local_f8);
  ParseHelper_Node_Enter(this_00,pNode);
  local_b8 = pNode + 1;
  if ((char)local_d0 == '\0') {
    local_cc = 0;
    local_c4 = 0;
    local_bc = 0;
    local_d0 = 0;
    local_c0 = 0;
    local_c8 = 0;
    do {
      do {
        while( true ) {
          iVar5 = (*this_00->mReader->_vptr_IIrrXMLReader[2])();
          if ((char)iVar5 == '\0') {
            local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"texmap","");
            Throw_CloseNotFound(this_00,&local_118);
            goto LAB_003cbd6e;
          }
          iVar5 = (*this_00->mReader->_vptr_IIrrXMLReader[3])();
          if (iVar5 != 1) break;
          local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"utex1","");
          (*this_00->mReader->_vptr_IIrrXMLReader[0xd])();
          iVar5 = std::__cxx11::string::compare((char *)&local_118);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_118._M_dataplus._M_p != &local_118.field_2) {
            operator_delete(local_118._M_dataplus._M_p);
          }
          this_00 = local_f8;
          if (iVar5 == 0) {
            if ((local_d0 & 1) != 0) {
              local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"utex1","");
              local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_f0,"Only one component can be defined.","");
              Throw_MoreThanOnceDefined(this_00,&local_118,&local_f0);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
                operator_delete(local_f0._M_dataplus._M_p);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_118._M_dataplus._M_p != &local_118.field_2) {
                operator_delete(local_118._M_dataplus._M_p);
              }
            }
            fVar11 = XML_ReadNode_GetVal_AsFloat(this_00);
            *(float *)&local_b8->_vptr_CAMFImporter_NodeElement = fVar11;
            local_d0 = (uint)CONCAT71((int7)((ulong)local_b8 >> 8),1);
          }
          else {
            local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"utex2","");
            (*local_f8->mReader->_vptr_IIrrXMLReader[0xd])();
            iVar5 = std::__cxx11::string::compare((char *)&local_118);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_118._M_dataplus._M_p != &local_118.field_2) {
              operator_delete(local_118._M_dataplus._M_p);
            }
            this_00 = local_f8;
            if (iVar5 == 0) {
              if ((local_bc & 1) != 0) {
                local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"utex2","");
                local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_f0,"Only one component can be defined.","");
                Throw_MoreThanOnceDefined(this_00,&local_118,&local_f0);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
                  operator_delete(local_f0._M_dataplus._M_p);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_118._M_dataplus._M_p != &local_118.field_2) {
                  operator_delete(local_118._M_dataplus._M_p);
                }
              }
              fVar11 = XML_ReadNode_GetVal_AsFloat(this_00);
              *(float *)&pNode[1].field_0xc = fVar11;
              local_bc = (uint)CONCAT71((int7)((ulong)extraout_RAX_04 >> 8),1);
            }
            else {
              local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"utex3","");
              (*local_f8->mReader->_vptr_IIrrXMLReader[0xd])();
              iVar5 = std::__cxx11::string::compare((char *)&local_118);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_118._M_dataplus._M_p != &local_118.field_2) {
                operator_delete(local_118._M_dataplus._M_p);
              }
              this_00 = local_f8;
              if (iVar5 == 0) {
                if ((local_c0 & 1) != 0) {
                  local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
                  std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"utex3","");
                  local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_f0,"Only one component can be defined.","");
                  Throw_MoreThanOnceDefined(this_00,&local_118,&local_f0);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
                    operator_delete(local_f0._M_dataplus._M_p);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_118._M_dataplus._M_p != &local_118.field_2) {
                    operator_delete(local_118._M_dataplus._M_p);
                  }
                }
                fVar11 = XML_ReadNode_GetVal_AsFloat(this_00);
                *(float *)&pNode[1].ID._M_string_length = fVar11;
                local_c0 = (uint)CONCAT71((int7)((ulong)extraout_RAX_05 >> 8),1);
              }
              else {
                local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"vtex1","");
                (*local_f8->mReader->_vptr_IIrrXMLReader[0xd])();
                iVar5 = std::__cxx11::string::compare((char *)&local_118);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_118._M_dataplus._M_p != &local_118.field_2) {
                  operator_delete(local_118._M_dataplus._M_p);
                }
                this_00 = local_f8;
                if (iVar5 == 0) {
                  if ((local_c4 & 1) != 0) {
                    local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
                    std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"vtex1","")
                    ;
                    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)&local_f0,"Only one component can be defined.","");
                    Throw_MoreThanOnceDefined(this_00,&local_118,&local_f0);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
                      operator_delete(local_f0._M_dataplus._M_p);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_118._M_dataplus._M_p != &local_118.field_2) {
                      operator_delete(local_118._M_dataplus._M_p);
                    }
                  }
                  fVar11 = XML_ReadNode_GetVal_AsFloat(this_00);
                  *(float *)((long)&pNode[1]._vptr_CAMFImporter_NodeElement + 4) = fVar11;
                  local_c4 = (uint)CONCAT71((int7)((ulong)extraout_RAX_06 >> 8),1);
                }
                else {
                  local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
                  std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"vtex2","");
                  (*local_f8->mReader->_vptr_IIrrXMLReader[0xd])();
                  iVar5 = std::__cxx11::string::compare((char *)&local_118);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_118._M_dataplus._M_p != &local_118.field_2) {
                    operator_delete(local_118._M_dataplus._M_p);
                  }
                  this_00 = local_f8;
                  if (iVar5 == 0) {
                    if ((local_c8 & 1) != 0) {
                      local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)&local_118,"vtex2","");
                      local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)&local_f0,"Only one component can be defined.","");
                      Throw_MoreThanOnceDefined(this_00,&local_118,&local_f0);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
                        operator_delete(local_f0._M_dataplus._M_p);
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_118._M_dataplus._M_p != &local_118.field_2) {
                        operator_delete(local_118._M_dataplus._M_p);
                      }
                    }
                    fVar11 = XML_ReadNode_GetVal_AsFloat(this_00);
                    *(float *)&pNode[1].ID._M_dataplus._M_p = fVar11;
                    local_c8 = (uint)CONCAT71((int7)((ulong)extraout_RAX_07 >> 8),1);
                  }
                  else {
                    local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
                    std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"vtex3","")
                    ;
                    (*local_f8->mReader->_vptr_IIrrXMLReader[0xd])();
                    iVar5 = std::__cxx11::string::compare((char *)&local_118);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_118._M_dataplus._M_p != &local_118.field_2) {
                      operator_delete(local_118._M_dataplus._M_p);
                    }
                    this_00 = local_f8;
                    if (iVar5 == 0) {
                      if ((local_cc & 1) != 0) {
                        local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
                        std::__cxx11::string::_M_construct<char_const*>
                                  ((string *)&local_118,"vtex3","");
                        local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
                        std::__cxx11::string::_M_construct<char_const*>
                                  ((string *)&local_f0,"Only one component can be defined.","");
                        Throw_MoreThanOnceDefined(this_00,&local_118,&local_f0);
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
                          operator_delete(local_f0._M_dataplus._M_p);
                        }
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_118._M_dataplus._M_p != &local_118.field_2) {
                          operator_delete(local_118._M_dataplus._M_p);
                        }
                      }
                      fVar11 = XML_ReadNode_GetVal_AsFloat(this_00);
                      *(float *)((long)&pNode[1].ID._M_string_length + 4) = fVar11;
                      local_cc = (uint)CONCAT71((int7)((ulong)extraout_RAX_08 >> 8),1);
                    }
                    else {
                      local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)&local_118,"texmap","");
                      this_00 = local_f8;
                      XML_CheckNode_SkipUnsupported(local_f8,&local_118);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_118._M_dataplus._M_p != &local_118.field_2) {
                        operator_delete(local_118._M_dataplus._M_p);
                      }
                    }
                  }
                }
              }
            }
          }
        }
        iVar5 = (*this_00->mReader->_vptr_IIrrXMLReader[3])();
      } while (iVar5 != 2);
      local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"texmap","");
      (*this_00->mReader->_vptr_IIrrXMLReader[0xd])();
      iVar5 = std::__cxx11::string::compare((char *)&local_118);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._M_dataplus._M_p != &local_118.field_2) {
        operator_delete(local_118._M_dataplus._M_p);
      }
      this_00 = local_f8;
    } while (iVar5 != 0);
  }
  else {
    local_cc = 0;
    local_c4 = 0;
    local_bc = 0;
    local_d0 = 0;
    local_c0 = 0;
    local_c8 = 0;
LAB_003caf8d:
    do {
      do {
        iVar5 = (*this_00->mReader->_vptr_IIrrXMLReader[2])();
        if ((char)iVar5 == '\0') {
          local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"map","");
          Throw_CloseNotFound(this_00,&local_118);
LAB_003cbd6e:
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_118._M_dataplus._M_p != &local_118.field_2) {
            operator_delete(local_118._M_dataplus._M_p);
          }
          goto LAB_003cbd81;
        }
        iVar5 = (*this_00->mReader->_vptr_IIrrXMLReader[3])();
        if (iVar5 == 1) {
          local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"u1","");
          (*this_00->mReader->_vptr_IIrrXMLReader[0xd])();
          iVar5 = std::__cxx11::string::compare((char *)&local_118);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_118._M_dataplus._M_p != &local_118.field_2) {
            operator_delete(local_118._M_dataplus._M_p);
          }
          this_00 = local_f8;
          if (iVar5 == 0) {
            if ((local_d0 & 1) != 0) {
              local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"u1","");
              local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_f0,"Only one component can be defined.","");
              Throw_MoreThanOnceDefined(this_00,&local_118,&local_f0);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
                operator_delete(local_f0._M_dataplus._M_p);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_118._M_dataplus._M_p != &local_118.field_2) {
                operator_delete(local_118._M_dataplus._M_p);
              }
            }
            fVar11 = XML_ReadNode_GetVal_AsFloat(this_00);
            *(float *)&local_b8->_vptr_CAMFImporter_NodeElement = fVar11;
            local_d0 = (uint)CONCAT71((int7)((ulong)local_b8 >> 8),1);
          }
          else {
            local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"u2","");
            (*local_f8->mReader->_vptr_IIrrXMLReader[0xd])();
            iVar5 = std::__cxx11::string::compare((char *)&local_118);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_118._M_dataplus._M_p != &local_118.field_2) {
              operator_delete(local_118._M_dataplus._M_p);
            }
            this_00 = local_f8;
            if (iVar5 == 0) {
              if ((local_bc & 1) != 0) {
                local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"u2","");
                local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_f0,"Only one component can be defined.","");
                Throw_MoreThanOnceDefined(this_00,&local_118,&local_f0);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
                  operator_delete(local_f0._M_dataplus._M_p);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_118._M_dataplus._M_p != &local_118.field_2) {
                  operator_delete(local_118._M_dataplus._M_p);
                }
              }
              fVar11 = XML_ReadNode_GetVal_AsFloat(this_00);
              *(float *)&pNode[1].field_0xc = fVar11;
              local_bc = (uint)CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
            }
            else {
              local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"u3","");
              (*local_f8->mReader->_vptr_IIrrXMLReader[0xd])();
              iVar5 = std::__cxx11::string::compare((char *)&local_118);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_118._M_dataplus._M_p != &local_118.field_2) {
                operator_delete(local_118._M_dataplus._M_p);
              }
              this_00 = local_f8;
              if (iVar5 == 0) {
                if ((local_c0 & 1) != 0) {
                  local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
                  std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"u3","");
                  local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_f0,"Only one component can be defined.","");
                  Throw_MoreThanOnceDefined(this_00,&local_118,&local_f0);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
                    operator_delete(local_f0._M_dataplus._M_p);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_118._M_dataplus._M_p != &local_118.field_2) {
                    operator_delete(local_118._M_dataplus._M_p);
                  }
                }
                fVar11 = XML_ReadNode_GetVal_AsFloat(this_00);
                *(float *)&pNode[1].ID._M_string_length = fVar11;
                local_c0 = (uint)CONCAT71((int7)((ulong)extraout_RAX_00 >> 8),1);
              }
              else {
                local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"v1","");
                (*local_f8->mReader->_vptr_IIrrXMLReader[0xd])();
                iVar5 = std::__cxx11::string::compare((char *)&local_118);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_118._M_dataplus._M_p != &local_118.field_2) {
                  operator_delete(local_118._M_dataplus._M_p);
                }
                this_00 = local_f8;
                if (iVar5 == 0) {
                  if ((local_c4 & 1) != 0) {
                    local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
                    std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"v1","");
                    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)&local_f0,"Only one component can be defined.","");
                    Throw_MoreThanOnceDefined(this_00,&local_118,&local_f0);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
                      operator_delete(local_f0._M_dataplus._M_p);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_118._M_dataplus._M_p != &local_118.field_2) {
                      operator_delete(local_118._M_dataplus._M_p);
                    }
                  }
                  fVar11 = XML_ReadNode_GetVal_AsFloat(this_00);
                  *(float *)((long)&pNode[1]._vptr_CAMFImporter_NodeElement + 4) = fVar11;
                  local_c4 = (uint)CONCAT71((int7)((ulong)extraout_RAX_01 >> 8),1);
                }
                else {
                  local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
                  std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"v2","");
                  (*local_f8->mReader->_vptr_IIrrXMLReader[0xd])();
                  iVar5 = std::__cxx11::string::compare((char *)&local_118);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_118._M_dataplus._M_p != &local_118.field_2) {
                    operator_delete(local_118._M_dataplus._M_p);
                  }
                  this_00 = local_f8;
                  if (iVar5 == 0) {
                    if ((local_c8 & 1) != 0) {
                      local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
                      std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"v2","");
                      local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)&local_f0,"Only one component can be defined.","");
                      Throw_MoreThanOnceDefined(this_00,&local_118,&local_f0);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
                        operator_delete(local_f0._M_dataplus._M_p);
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_118._M_dataplus._M_p != &local_118.field_2) {
                        operator_delete(local_118._M_dataplus._M_p);
                      }
                    }
                    fVar11 = XML_ReadNode_GetVal_AsFloat(this_00);
                    *(float *)&pNode[1].ID._M_dataplus._M_p = fVar11;
                    local_c8 = (uint)CONCAT71((int7)((ulong)extraout_RAX_02 >> 8),1);
                  }
                  else {
                    local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
                    std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"v3","");
                    (*local_f8->mReader->_vptr_IIrrXMLReader[0xd])();
                    iVar5 = std::__cxx11::string::compare((char *)&local_118);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_118._M_dataplus._M_p != &local_118.field_2) {
                      operator_delete(local_118._M_dataplus._M_p);
                    }
                    this_00 = local_f8;
                    if (iVar5 == 0) {
                      if ((local_cc & 1) != 0) {
                        local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
                        std::__cxx11::string::_M_construct<char_const*>
                                  ((string *)&local_118,"v3","");
                        local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
                        std::__cxx11::string::_M_construct<char_const*>
                                  ((string *)&local_f0,"Only one component can be defined.","");
                        Throw_MoreThanOnceDefined(this_00,&local_118,&local_f0);
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
                          operator_delete(local_f0._M_dataplus._M_p);
                        }
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_118._M_dataplus._M_p != &local_118.field_2) {
                          operator_delete(local_118._M_dataplus._M_p);
                        }
                      }
                      fVar11 = XML_ReadNode_GetVal_AsFloat(this_00);
                      *(float *)((long)&pNode[1].ID._M_string_length + 4) = fVar11;
                      local_cc = (uint)CONCAT71((int7)((ulong)extraout_RAX_03 >> 8),1);
                    }
                    else {
                      local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
                      std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"map","")
                      ;
                      this_00 = local_f8;
                      XML_CheckNode_SkipUnsupported(local_f8,&local_118);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_118._M_dataplus._M_p != &local_118.field_2) {
                        operator_delete(local_118._M_dataplus._M_p);
                      }
                    }
                  }
                }
              }
            }
          }
          goto LAB_003caf8d;
        }
        iVar5 = (*this_00->mReader->_vptr_IIrrXMLReader[3])();
      } while (iVar5 != 2);
      local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"map","");
      (*this_00->mReader->_vptr_IIrrXMLReader[0xd])();
      iVar5 = std::__cxx11::string::compare((char *)&local_118);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._M_dataplus._M_p != &local_118.field_2) {
        operator_delete(local_118._M_dataplus._M_p);
      }
      this_00 = local_f8;
    } while (iVar5 != 0);
  }
LAB_003cbd81:
  ParseHelper_Node_Exit(this_00);
  if (((((local_d0 & 1) != 0) && ((local_bc & 1) != 0)) &&
      (((local_c0 & 1) != 0 && (((local_c4 & 1) != 0 && ((local_c8 & 1) != 0)))))) &&
     ((local_cc & 1) != 0)) {
    std::__cxx11::string::_M_assign((string *)(pNode[1].ID.field_2._M_local_buf + 8));
    std::__cxx11::string::_M_assign
              ((string *)
               &pNode[1].Child.
                super__List_base<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_>
                ._M_impl._M_node._M_size);
    std::__cxx11::string::_M_assign((string *)&pNode[2].ID._M_string_length);
    std::__cxx11::string::_M_assign((string *)&pNode[2].Child);
    p_Var6 = (_List_node_base *)operator_new(0x18);
    p_Var6[1]._M_next = (_List_node_base *)pNode;
    std::__detail::_List_node_base::_M_hook(p_Var6);
    psVar1 = &(this_00->mNodeElement_List).
              super__List_base<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_>
              ._M_impl._M_node._M_size;
    *psVar1 = *psVar1 + 1;
    if (local_50 != local_40) {
      operator_delete(local_50);
    }
    if (local_b0 != local_a0) {
      operator_delete(local_b0);
    }
    if (local_90 != local_80) {
      operator_delete(local_90);
    }
    if (local_70 != local_60) {
      operator_delete(local_70);
    }
    return;
  }
  prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
  local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_118,"Not all texture coordinates are defined.","");
  std::runtime_error::runtime_error(prVar7,(string *)&local_118);
  *(undefined ***)prVar7 = &PTR__runtime_error_007fc4b8;
  __cxa_throw(prVar7,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void AMFImporter::ParseNode_TexMap(const bool pUseOldName) {
    std::string rtexid, gtexid, btexid, atexid;

	// Read attributes for node <color>.
	MACRO_ATTRREAD_LOOPBEG;
		MACRO_ATTRREAD_CHECK_RET("rtexid", rtexid, mReader->getAttributeValue);
		MACRO_ATTRREAD_CHECK_RET("gtexid", gtexid, mReader->getAttributeValue);
		MACRO_ATTRREAD_CHECK_RET("btexid", btexid, mReader->getAttributeValue);
		MACRO_ATTRREAD_CHECK_RET("atexid", atexid, mReader->getAttributeValue);
	MACRO_ATTRREAD_LOOPEND;

	// create new texture coordinates object.
    CAMFImporter_NodeElement *ne = new CAMFImporter_NodeElement_TexMap(mNodeElement_Cur);

	CAMFImporter_NodeElement_TexMap& als = *((CAMFImporter_NodeElement_TexMap*)ne);// alias for convenience
	// check data
	if(rtexid.empty() && gtexid.empty() && btexid.empty()) throw DeadlyImportError("ParseNode_TexMap. At least one texture ID must be defined.");
	// Check for children nodes
	XML_CheckNode_MustHaveChildren();
	// read children nodes
	bool read_flag[6] = { false, false, false, false, false, false };

	ParseHelper_Node_Enter(ne);
	if(!pUseOldName)
	{
		MACRO_NODECHECK_LOOPBEGIN("texmap");
			MACRO_NODECHECK_READCOMP_F("utex1", read_flag[0], als.TextureCoordinate[0].x);
			MACRO_NODECHECK_READCOMP_F("utex2", read_flag[1], als.TextureCoordinate[1].x);
			MACRO_NODECHECK_READCOMP_F("utex3", read_flag[2], als.TextureCoordinate[2].x);
			MACRO_NODECHECK_READCOMP_F("vtex1", read_flag[3], als.TextureCoordinate[0].y);
			MACRO_NODECHECK_READCOMP_F("vtex2", read_flag[4], als.TextureCoordinate[1].y);
			MACRO_NODECHECK_READCOMP_F("vtex3", read_flag[5], als.TextureCoordinate[2].y);
		MACRO_NODECHECK_LOOPEND("texmap");
	}
	else
	{
		MACRO_NODECHECK_LOOPBEGIN("map");
			MACRO_NODECHECK_READCOMP_F("u1", read_flag[0], als.TextureCoordinate[0].x);
			MACRO_NODECHECK_READCOMP_F("u2", read_flag[1], als.TextureCoordinate[1].x);
			MACRO_NODECHECK_READCOMP_F("u3", read_flag[2], als.TextureCoordinate[2].x);
			MACRO_NODECHECK_READCOMP_F("v1", read_flag[3], als.TextureCoordinate[0].y);
			MACRO_NODECHECK_READCOMP_F("v2", read_flag[4], als.TextureCoordinate[1].y);
			MACRO_NODECHECK_READCOMP_F("v3", read_flag[5], als.TextureCoordinate[2].y);
		MACRO_NODECHECK_LOOPEND("map");
	}// if(!pUseOldName) else

	ParseHelper_Node_Exit();

	// check that all components was defined
	if(!(read_flag[0] && read_flag[1] && read_flag[2] && read_flag[3] && read_flag[4] && read_flag[5]))
		throw DeadlyImportError("Not all texture coordinates are defined.");

	// copy attributes data
	als.TextureID_R = rtexid;
	als.TextureID_G = gtexid;
	als.TextureID_B = btexid;
	als.TextureID_A = atexid;

	mNodeElement_List.push_back(ne);// add to node element list because its a new object in graph.
}